

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pstring.cpp
# Opt level: O1

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar1;
  basic_pstring<wchar_t> bVar2;
  bool bVar3;
  int iVar4;
  byte bVar5;
  wchar_t wVar6;
  int __n2;
  pstring ps;
  pstring ps2;
  basic_pstring<wchar_t> local_58;
  basic_pstring<wchar_t> local_50;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_48;
  undefined4 local_24;
  
  if (boost::detail::test_results()::instance == '\0') {
    main_cold_1();
  }
  local_48._M_dataplus._M_p._0_4_ = 7;
  local_50.data_._0_4_ = 7;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_int,int>
            ("wide.size()","7",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x18,"int main()",&local_48,&local_50);
  if (boost::detail::test_results()::instance == '\0') {
    main_cold_2();
  }
  local_50.data_._0_1_ = 7;
  local_48._M_dataplus._M_p._0_4_ = 7;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("narrow.size()","7",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x1e,"int main()",&local_50,&local_48);
  if (boost::detail::test_results()::instance == '\0') {
    main_cold_3();
  }
  local_48._M_dataplus._M_p._0_4_ = 4;
  local_50.data_._0_4_ = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_int,int>
            ("wide.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x25,"int main()",&local_48,&local_50);
  if (boost::detail::test_results()::instance == '\0') {
    main_cold_4();
  }
  local_50.data_._0_1_ = 4;
  local_48._M_dataplus._M_p._0_4_ = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("narrow.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x2c,"int main()",&local_50,&local_48);
  local_50.data_ = (wchar_t *)0x0;
  local_50.data_ = (wchar_t *)operator_new(5);
  *(undefined1 *)local_50.data_ = 4;
  *(undefined4 *)((long)local_50.data_ + 1) = 0x74736554;
  if (boost::detail::test_results()::instance == '\0') {
    main_cold_5();
  }
  paVar1 = &local_48.field_2;
  local_48.field_2._M_local_buf[0] = L'\x74736554';
  local_48._M_string_length = 4;
  local_48.field_2._M_local_buf[1] = local_48.field_2._M_local_buf[1] & 0xffffff00;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  xll::basic_pstring<char>::basic_pstring
            ((basic_pstring<char> *)&local_58,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48);
  bVar3 = xll::operator==((basic_pstring<char> *)&local_50,(basic_pstring<char> *)&local_58);
  boost::detail::test_impl
            ("ps == \"Test\"s",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x33,"int main()",bVar3);
  if (local_58.data_ != (wchar_t *)0x0) {
    operator_delete(local_58.data_,1);
    local_58.data_ = (wchar_t *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,
                    CONCAT44(local_48.field_2._M_local_buf[1],local_48.field_2._M_local_buf[0]) + 1)
    ;
  }
  if (local_50.data_ != (wchar_t *)0x0) {
    operator_delete(local_50.data_,1);
  }
  local_50.data_ = (wchar_t *)0x0;
  local_50.data_ = (wchar_t *)operator_new(0x14);
  builtin_wcsncpy(local_50.data_,L"\x04Test",5);
  if (boost::detail::test_results()::instance == '\0') {
    main_cold_6();
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_48,L"Test",L"");
  xll::basic_pstring<wchar_t>::basic_pstring(&local_58,&local_48);
  bVar3 = xll::operator==(&local_50,&local_58);
  boost::detail::test_impl
            ("wps == L\"Test\"s",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x3a,"int main()",bVar3);
  if (local_58.data_ != (wchar_t *)0x0) {
    operator_delete(local_58.data_,4);
    local_58.data_ = (wchar_t *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,
                    CONCAT44(local_48.field_2._M_local_buf[1],local_48.field_2._M_local_buf[0]) * 4
                    + 4);
  }
  if (local_50.data_ != (pointer)0x0) {
    operator_delete(local_50.data_,4);
    local_50.data_ = (pointer)0x0;
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Test","");
  xll::basic_pstring<char>::basic_pstring
            ((basic_pstring<char> *)&local_50,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,
                    CONCAT44(local_48.field_2._M_local_buf[1],local_48.field_2._M_local_buf[0]) + 1)
    ;
  }
  if (local_50.data_ == (pointer)0x0) {
    local_48._M_dataplus._M_p = (pointer)0x0;
  }
  else {
    local_48._M_dataplus._M_p = (pointer)(long)(char)(byte)*local_50.data_;
  }
  local_58.data_._0_4_ = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("ps.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x3f,"int main()",&local_48,&local_58);
  local_48.field_2._M_local_buf[0] = L'\x74736554';
  local_48._M_string_length = 4;
  local_48.field_2._M_local_buf[1] = local_48.field_2._M_local_buf[1] & 0xffffff00;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  xll::basic_pstring<char>::basic_pstring
            ((basic_pstring<char> *)&local_58,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48);
  bVar3 = xll::operator==((basic_pstring<char> *)&local_50,(basic_pstring<char> *)&local_58);
  boost::detail::test_impl
            ("ps == \"Test\"s",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x40,"int main()",bVar3);
  if (local_58.data_ != (wchar_t *)0x0) {
    operator_delete(local_58.data_,1);
    local_58.data_ = (wchar_t *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,
                    CONCAT44(local_48.field_2._M_local_buf[1],local_48.field_2._M_local_buf[0]) + 1)
    ;
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_48,L"Test",L"");
  xll::basic_pstring<char>::basic_pstring<wchar_t,_nullptr>
            ((basic_pstring<char> *)&local_58,&local_48);
  bVar3 = xll::operator==((basic_pstring<char> *)&local_50,(basic_pstring<char> *)&local_58);
  boost::detail::test_impl
            ("ps == L\"Test\"s",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x41,"int main()",bVar3);
  if (local_58.data_ != (wchar_t *)0x0) {
    operator_delete(local_58.data_,1);
    local_58.data_ = (wchar_t *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,
                    CONCAT44(local_48.field_2._M_local_buf[1],local_48.field_2._M_local_buf[0]) * 4
                    + 4);
  }
  if (local_50.data_ == (pointer)0x0) {
    bVar5 = 0;
  }
  else {
    bVar5 = (byte)*local_50.data_;
  }
  if (bVar5 == 4) {
    iVar4 = bcmp((byte *)((long)local_50.data_ + 1),"Test",4);
    bVar3 = iVar4 == 0;
  }
  else {
    bVar3 = false;
  }
  boost::detail::test_impl
            ("ps == \"Test\"sv",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x42,"int main()",bVar3);
  if (local_50.data_ != (pointer)0x0) {
    operator_delete(local_50.data_,1);
    local_50.data_ = (pointer)0x0;
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_48,L"Test",L"");
  xll::basic_pstring<char>::basic_pstring<wchar_t,_nullptr>
            ((basic_pstring<char> *)&local_50,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,
                    CONCAT44(local_48.field_2._M_local_buf[1],local_48.field_2._M_local_buf[0]) * 4
                    + 4);
  }
  if (local_50.data_ == (pointer)0x0) {
    local_48._M_dataplus._M_p = (pointer)0x0;
  }
  else {
    local_48._M_dataplus._M_p = (pointer)(long)(char)(byte)*local_50.data_;
  }
  local_58.data_._0_4_ = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("ps.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x47,"int main()",&local_48,&local_58);
  local_48.field_2._M_local_buf[0] = L'\x74736554';
  local_48._M_string_length = 4;
  local_48.field_2._M_local_buf[1] = local_48.field_2._M_local_buf[1] & 0xffffff00;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  xll::basic_pstring<char>::basic_pstring
            ((basic_pstring<char> *)&local_58,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48);
  bVar3 = xll::operator==((basic_pstring<char> *)&local_50,(basic_pstring<char> *)&local_58);
  boost::detail::test_impl
            ("ps == \"Test\"s",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x48,"int main()",bVar3);
  if (local_58.data_ != (wchar_t *)0x0) {
    operator_delete(local_58.data_,1);
    local_58.data_ = (wchar_t *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,
                    CONCAT44(local_48.field_2._M_local_buf[1],local_48.field_2._M_local_buf[0]) + 1)
    ;
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_48,L"Test",L"");
  xll::basic_pstring<char>::basic_pstring<wchar_t,_nullptr>
            ((basic_pstring<char> *)&local_58,&local_48);
  bVar3 = xll::operator==((basic_pstring<char> *)&local_50,(basic_pstring<char> *)&local_58);
  boost::detail::test_impl
            ("ps == L\"Test\"s",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x49,"int main()",bVar3);
  if (local_58.data_ != (wchar_t *)0x0) {
    operator_delete(local_58.data_,1);
    local_58.data_ = (wchar_t *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,
                    CONCAT44(local_48.field_2._M_local_buf[1],local_48.field_2._M_local_buf[0]) * 4
                    + 4);
  }
  if (local_50.data_ == (pointer)0x0) {
    bVar5 = 0;
  }
  else {
    bVar5 = (byte)*local_50.data_;
  }
  if (bVar5 == 4) {
    iVar4 = bcmp((byte *)((long)local_50.data_ + 1),"Test",4);
    bVar3 = iVar4 == 0;
  }
  else {
    bVar3 = false;
  }
  boost::detail::test_impl
            ("ps == \"Test\"sv",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x4a,"int main()",bVar3);
  if (local_50.data_ != (pointer)0x0) {
    operator_delete(local_50.data_,1);
    local_50.data_ = (pointer)0x0;
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Test","");
  xll::basic_pstring<wchar_t>::basic_pstring<char,_nullptr>
            (&local_50,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,
                    CONCAT44(local_48.field_2._M_local_buf[1],local_48.field_2._M_local_buf[0]) + 1)
    ;
  }
  if (local_50.data_ == (pointer)0x0) {
    local_48._M_dataplus._M_p = (pointer)0x0;
  }
  else {
    local_48._M_dataplus._M_p = (pointer)(long)*local_50.data_;
  }
  local_58.data_._0_4_ = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("wps.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x4f,"int main()",&local_48,&local_58);
  local_48.field_2._M_local_buf[0] = L'\x74736554';
  local_48._M_string_length = 4;
  local_48.field_2._M_local_buf[1] = local_48.field_2._M_local_buf[1] & 0xffffff00;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  xll::basic_pstring<wchar_t>::basic_pstring<char,_nullptr>
            (&local_58,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48);
  bVar3 = xll::operator==(&local_50,&local_58);
  boost::detail::test_impl
            ("wps == \"Test\"s",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x50,"int main()",bVar3);
  if (local_58.data_ != (wchar_t *)0x0) {
    operator_delete(local_58.data_,4);
    local_58.data_ = (wchar_t *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,
                    CONCAT44(local_48.field_2._M_local_buf[1],local_48.field_2._M_local_buf[0]) + 1)
    ;
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_48,L"Test",L"");
  xll::basic_pstring<wchar_t>::basic_pstring(&local_58,&local_48);
  bVar3 = xll::operator==(&local_50,&local_58);
  boost::detail::test_impl
            ("wps == L\"Test\"s",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x51,"int main()",bVar3);
  if (local_58.data_ != (wchar_t *)0x0) {
    operator_delete(local_58.data_,4);
    local_58.data_ = (wchar_t *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,
                    CONCAT44(local_48.field_2._M_local_buf[1],local_48.field_2._M_local_buf[0]) * 4
                    + 4);
  }
  if (local_50.data_ == (pointer)0x0) {
    wVar6 = L'\0';
  }
  else {
    wVar6 = *local_50.data_;
  }
  if (wVar6 == L'\x04') {
    iVar4 = wmemcmp(local_50.data_ + 1,L"Test",4);
    bVar3 = iVar4 == 0;
  }
  else {
    bVar3 = false;
  }
  boost::detail::test_impl
            ("wps == L\"Test\"sv",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x52,"int main()",bVar3);
  if (local_50.data_ != (pointer)0x0) {
    operator_delete(local_50.data_,4);
    local_50.data_ = (pointer)0x0;
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_48,L"Test",L"");
  xll::basic_pstring<wchar_t>::basic_pstring(&local_50,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,
                    CONCAT44(local_48.field_2._M_local_buf[1],local_48.field_2._M_local_buf[0]) * 4
                    + 4);
  }
  if (local_50.data_ == (pointer)0x0) {
    local_48._M_dataplus._M_p = (pointer)0x0;
  }
  else {
    local_48._M_dataplus._M_p = (pointer)(long)*local_50.data_;
  }
  local_58.data_._0_4_ = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("wps.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x57,"int main()",&local_48,&local_58);
  local_48.field_2._M_local_buf[0] = L'\x74736554';
  local_48._M_string_length = 4;
  local_48.field_2._M_local_buf[1] = local_48.field_2._M_local_buf[1] & 0xffffff00;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  xll::basic_pstring<wchar_t>::basic_pstring<char,_nullptr>
            (&local_58,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48);
  bVar3 = xll::operator==(&local_50,&local_58);
  boost::detail::test_impl
            ("wps == \"Test\"s",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x58,"int main()",bVar3);
  if (local_58.data_ != (wchar_t *)0x0) {
    operator_delete(local_58.data_,4);
    local_58.data_ = (wchar_t *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,
                    CONCAT44(local_48.field_2._M_local_buf[1],local_48.field_2._M_local_buf[0]) + 1)
    ;
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_48,L"Test",L"");
  xll::basic_pstring<wchar_t>::basic_pstring(&local_58,&local_48);
  bVar3 = xll::operator==(&local_50,&local_58);
  boost::detail::test_impl
            ("wps == L\"Test\"s",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x59,"int main()",bVar3);
  if (local_58.data_ != (wchar_t *)0x0) {
    operator_delete(local_58.data_,4);
    local_58.data_ = (wchar_t *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,
                    CONCAT44(local_48.field_2._M_local_buf[1],local_48.field_2._M_local_buf[0]) * 4
                    + 4);
  }
  if (local_50.data_ == (pointer)0x0) {
    wVar6 = L'\0';
  }
  else {
    wVar6 = *local_50.data_;
  }
  if (wVar6 == L'\x04') {
    iVar4 = wmemcmp(local_50.data_ + 1,L"Test",4);
    bVar3 = iVar4 == 0;
  }
  else {
    bVar3 = false;
  }
  boost::detail::test_impl
            ("wps == L\"Test\"sv",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x5a,"int main()",bVar3);
  if (local_50.data_ != (pointer)0x0) {
    operator_delete(local_50.data_,4);
    local_50.data_ = (pointer)0x0;
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Copy","");
  xll::basic_pstring<char>::basic_pstring
            ((basic_pstring<char> *)&local_50,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,
                    CONCAT44(local_48.field_2._M_local_buf[1],local_48.field_2._M_local_buf[0]) + 1)
    ;
  }
  bVar2.data_ = local_50.data_;
  local_48._M_dataplus._M_p = (pointer)0x0;
  if (local_50.data_ != (pointer)0x0) {
    bVar5 = (byte)*local_50.data_;
    local_48._M_dataplus._M_p = (pointer)operator_new((ulong)bVar5 + 1);
    *(byte *)local_48._M_dataplus._M_p = bVar5;
    if (bVar5 != 0) {
      memcpy((byte *)((long)local_48._M_dataplus._M_p + 1),(byte *)((long)bVar2.data_ + 1),
             (ulong)bVar5);
    }
  }
  if (local_50.data_ == (pointer)0x0) {
    local_58.data_ = (wchar_t *)0x0;
  }
  else {
    local_58.data_ = (wchar_t *)(long)(char)(byte)*local_50.data_;
  }
  local_24 = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("ps1.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x60,"int main()",&local_58,&local_24);
  if (local_48._M_dataplus._M_p == (pointer)0x0) {
    local_58.data_ = (wchar_t *)0x0;
  }
  else {
    local_58.data_ = (wchar_t *)(long)(char)(byte)*local_48._M_dataplus._M_p;
  }
  local_24 = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("ps2.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x61,"int main()",&local_58,&local_24);
  xll::basic_pstring<char>::basic_pstring((basic_pstring<char> *)&local_58,"Copy");
  bVar3 = xll::operator==((basic_pstring<char> *)&local_50,(basic_pstring<char> *)&local_58);
  boost::detail::test_impl
            ("ps1 == \"Copy\"",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x62,"int main()",bVar3);
  if (local_58.data_ != (wchar_t *)0x0) {
    operator_delete(local_58.data_,1);
    local_58.data_ = (wchar_t *)0x0;
  }
  xll::basic_pstring<char>::basic_pstring((basic_pstring<char> *)&local_58,"Copy");
  bVar3 = xll::operator==((basic_pstring<char> *)&local_48,(basic_pstring<char> *)&local_58);
  boost::detail::test_impl
            ("ps2 == \"Copy\"",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,99,"int main()",bVar3);
  if (local_58.data_ != (wchar_t *)0x0) {
    operator_delete(local_58.data_,1);
    local_58.data_ = (wchar_t *)0x0;
  }
  if (local_48._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_48._M_dataplus._M_p,1);
    local_48._M_dataplus._M_p = (pointer)0x0;
  }
  if (local_50.data_ != (pointer)0x0) {
    operator_delete(local_50.data_,1);
    local_50.data_ = (pointer)0x0;
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Move","");
  xll::basic_pstring<char>::basic_pstring
            ((basic_pstring<char> *)&local_50,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,
                    CONCAT44(local_48.field_2._M_local_buf[1],local_48.field_2._M_local_buf[0]) + 1)
    ;
  }
  if (local_50.data_ == (pointer)0x0) {
    local_48._M_dataplus._M_p = (pointer)0x0;
  }
  else {
    local_48._M_dataplus._M_p = (pointer)(long)(char)(byte)*local_50.data_;
  }
  local_58.data_._0_4_ = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("ps1.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x68,"int main()",&local_48,&local_58);
  local_48._M_dataplus._M_p = local_50.data_;
  local_50.data_ = (wchar_t *)0x0;
  local_58.data_ = (wchar_t *)0x0;
  local_24 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("ps1.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x6a,"int main()",&local_58,&local_24);
  if (local_48._M_dataplus._M_p == (pointer)0x0) {
    local_58.data_ = (wchar_t *)0x0;
  }
  else {
    local_58.data_ = (wchar_t *)(long)(char)(byte)*local_48._M_dataplus._M_p;
  }
  local_24 = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("ps2.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x6b,"int main()",&local_58,&local_24);
  xll::basic_pstring<char>::basic_pstring((basic_pstring<char> *)&local_58,"Move");
  bVar3 = xll::operator==((basic_pstring<char> *)&local_48,(basic_pstring<char> *)&local_58);
  boost::detail::test_impl
            ("ps2 == \"Move\"",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x6c,"int main()",bVar3);
  if (local_58.data_ != (wchar_t *)0x0) {
    operator_delete(local_58.data_,1);
    local_58.data_ = (wchar_t *)0x0;
  }
  if (local_48._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_48._M_dataplus._M_p,1);
    local_48._M_dataplus._M_p = (pointer)0x0;
  }
  if (local_50.data_ != (wchar_t *)0x0) {
    operator_delete(local_50.data_,1);
    local_50.data_ = (wchar_t *)0x0;
  }
  iVar4 = boost::report_errors();
  return iVar4;
}

Assistant:

int main()
{
    using namespace std::string_literals;
    using namespace std::string_view_literals;

    {
        // compile-time wide pstring view
        constexpr auto wide = make_wpstring_view(L"Literal");
        BOOST_TEST(std::wstring_view(wide) == L"Literal");
        BOOST_TEST_EQ(wide.size(), 7);
    }
    {
        // compile-time narrow pstring view
        constexpr auto narrow = make_pstring_view("Literal");
        BOOST_TEST(std::string_view(narrow) == "Literal");
        BOOST_TEST_EQ(narrow.size(), 7);
    }
    {
        // compile-time wide pstring array
        constexpr std::array<wchar_t, 4> arr {{ L'T', L'E', L'S', L'T' }};
        constexpr auto wide = make_wpstring_array(arr);
        BOOST_TEST(std::wstring_view(wide) == L"TEST");
        BOOST_TEST_EQ(wide.size(), 4);
    }
    {
        // compile-time narrow pstring array
        constexpr std::array<char, 4> arr {{ 'T', 'E', 'S', 'T' }};
        constexpr auto narrow = make_pstring_array(arr);
        BOOST_TEST(std::string_view(narrow) == "TEST");
        BOOST_TEST_EQ(narrow.size(), 4);
    }
    {
        // narrow pstring literals
        using namespace xll::pstring_literals;
        auto ps = "Test"_ps;
        BOOST_TEST_TRAIT_TRUE((std::is_same<decltype(ps), pstring>));
        BOOST_TEST(ps == "Test"s);
    }
    {
        // wide pstring literals
        using namespace xll::pstring_literals;
        auto wps = L"Test"_ps;
        BOOST_TEST_TRAIT_TRUE((std::is_same<decltype(wps), wpstring>));
        BOOST_TEST(wps == L"Test"s);
    }
    {
        // narrow pstring with no conversion
        pstring ps(std::string("Test"));
        BOOST_TEST_EQ(ps.size(), 4);
        BOOST_TEST(ps == "Test"s);
        BOOST_TEST(ps == L"Test"s);
        BOOST_TEST(ps == "Test"sv);
    }
    {
        // narrow pstring with UTF-16 to UTF-8 conversion
        pstring ps(std::wstring(L"Test"));
        BOOST_TEST_EQ(ps.size(), 4);
        BOOST_TEST(ps == "Test"s);
        BOOST_TEST(ps == L"Test"s);
        BOOST_TEST(ps == "Test"sv);
    }
    {
        // wide pstring with UTF-8 to UTF-16 conversion
        wpstring wps(std::string("Test"));
        BOOST_TEST_EQ(wps.size(), 4);
        BOOST_TEST(wps == "Test"s);
        BOOST_TEST(wps == L"Test"s);
        BOOST_TEST(wps == L"Test"sv);
    }
    {
        // wide pstring with no conversion
        wpstring wps(std::wstring(L"Test"));
        BOOST_TEST_EQ(wps.size(), 4);
        BOOST_TEST(wps == "Test"s);
        BOOST_TEST(wps == L"Test"s);
        BOOST_TEST(wps == L"Test"sv);
    }
    {
        // copy construct
        pstring ps1(std::string("Copy"));
        pstring ps2(ps1);
        BOOST_TEST_EQ(ps1.size(), 4);
        BOOST_TEST_EQ(ps2.size(), 4);
        BOOST_TEST(ps1 == "Copy");
        BOOST_TEST(ps2 == "Copy");
    }
    {
        // move construct
        pstring ps1(std::string("Move"));
        BOOST_TEST_EQ(ps1.size(), 4);
        pstring ps2(std::move(ps1));
        BOOST_TEST_EQ(ps1.size(), 0);
        BOOST_TEST_EQ(ps2.size(), 4);
        BOOST_TEST(ps2 == "Move");
    }

    return boost::report_errors();
}